

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O2

void __thiscall FPTest_Normalize_Test::TestBody(FPTest_Normalize_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  AssertionResult gtest_ar;
  fp v;
  
  v.f = 0xbeef;
  v.e = 0x2a;
  fmt::v5::internal::fp::normalize<0>(&v);
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbeef000000000000
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"0xbeef000000000000","v.f",(unsigned_long *)&local_40,&v.f);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x36,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.ptr_._0_4_ = 0xfffffffa;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"-6","v.e",(int *)&local_40,&v.e);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x37,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FPTest, Normalize) {
  auto v = fp(0xbeef, 42);
  v.normalize();
  EXPECT_EQ(0xbeef000000000000, v.f);
  EXPECT_EQ(-6, v.e);
}